

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O1

void __thiscall QRasterPaintEnginePrivate::systemStateChanged(QRasterPaintEnginePrivate *this)

{
  QRegion *r;
  QPaintEngineState *pQVar1;
  Representation RVar2;
  Representation RVar3;
  Representation RVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  QRect QVar9;
  QRegion clippedDeviceRgn;
  QRegion local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = (*this->device->_vptr_QPaintDevice[4])(this->device,1);
  if (0x7ffffe < iVar6) {
    iVar6 = 0x7fffff;
  }
  iVar7 = (*this->device->_vptr_QPaintDevice[4])(this->device,2);
  iVar8 = 0x7fffff;
  if (iVar7 < 0x7fffff) {
    iVar8 = iVar7;
  }
  (this->deviceRectUnclipped).x1 = 0;
  (this->deviceRectUnclipped).y1 = 0;
  (this->deviceRectUnclipped).x2.m_i = iVar6 + -1;
  (this->deviceRectUnclipped).y2.m_i = iVar8 + -1;
  r = &(this->super_QPaintEngineExPrivate).super_QPaintEnginePrivate.systemClip;
  bVar5 = QRegion::isEmpty(r);
  if (bVar5) {
    RVar2.m_i = (this->deviceRectUnclipped).y1.m_i;
    RVar3.m_i = (this->deviceRectUnclipped).x2.m_i;
    RVar4.m_i = (this->deviceRectUnclipped).y2.m_i;
    (this->deviceRect).x1 = (Representation)(this->deviceRectUnclipped).x1.m_i;
    (this->deviceRect).y1 = (Representation)RVar2.m_i;
    (this->deviceRect).x2 = (Representation)RVar3.m_i;
    (this->deviceRect).y2 = (Representation)RVar4.m_i;
    QClipData::setClipRect((this->baseClip).d,&this->deviceRect);
  }
  else {
    local_38.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::operator&(&local_38,(QRect *)r);
    QVar9 = QRegion::boundingRect(&local_38);
    this->deviceRect = QVar9;
    QClipData::setClipRegion((this->baseClip).d,&local_38);
    QRegion::~QRegion(&local_38);
  }
  iVar6 = (this->deviceRect).y1.m_i;
  iVar8 = (this->deviceRect).x2.m_i;
  iVar7 = (this->deviceRect).y2.m_i;
  (this->super_QPaintEngineExPrivate).exDeviceRect.x1.m_i = (this->deviceRect).x1.m_i;
  (this->super_QPaintEngineExPrivate).exDeviceRect.y1.m_i = iVar6;
  (this->super_QPaintEngineExPrivate).exDeviceRect.x2.m_i = iVar8;
  (this->super_QPaintEngineExPrivate).exDeviceRect.y2.m_i = iVar7;
  pQVar1 = ((this->super_QPaintEngineExPrivate).super_QPaintEnginePrivate.q_ptr)->state;
  if (pQVar1 != (QPaintEngineState *)0x0) {
    *(byte *)&pQVar1[0xb4].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
              super_QFlagsStorage<QPaintEngine::DirtyFlag>.i =
         (byte)pQVar1[0xb4].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
               super_QFlagsStorage<QPaintEngine::DirtyFlag>.i | 0x80;
    *(ulong *)(pQVar1 + 0xfa) = *(ulong *)(pQVar1 + 0xfa) | 0x8000000080;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEnginePrivate::systemStateChanged()
{
    deviceRectUnclipped = QRect(0, 0,
            qMin(QT_RASTER_COORD_LIMIT, device->width()),
            qMin(QT_RASTER_COORD_LIMIT, device->height()));

    if (!systemClip.isEmpty()) {
        QRegion clippedDeviceRgn = systemClip & deviceRectUnclipped;
        deviceRect = clippedDeviceRgn.boundingRect();
        baseClip->setClipRegion(clippedDeviceRgn);
    } else {
        deviceRect = deviceRectUnclipped;
        baseClip->setClipRect(deviceRect);
    }
#ifdef QT_DEBUG_DRAW
    qDebug() << "systemStateChanged" << this << "deviceRect" << deviceRect << deviceRectUnclipped << systemClip;
#endif

    exDeviceRect = deviceRect;

    Q_Q(QRasterPaintEngine);
    if (q->state()) {
        q->state()->strokeFlags |= QPaintEngine::DirtyClipRegion;
        q->state()->fillFlags |= QPaintEngine::DirtyClipRegion;
        q->state()->pixmapFlags |= QPaintEngine::DirtyClipRegion;
    }
}